

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.c
# Opt level: O1

void basic_tests(zt_unit_test *test,void *data)

{
  int iVar1;
  zt_log_ty *log;
  zt_log_ty *log_00;
  FILE *__stream;
  char *pcVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int date;
  int pid;
  char msg [255];
  char sysname [255];
  char time [255];
  char month [255];
  char progname [255];
  char level [255];
  char position2 [255];
  char position1 [255];
  
  log = zt_log_file("log.err",0,0x1f);
  zt_progname("./unit_test",1);
  log_00 = zt_log_logger(log);
  zt_log_set_opts(log,0);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_RAW");
  zt_log_set_opts(log,1);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_DATE");
  zt_log_set_opts(log,2);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_LEVEL");
  zt_log_set_opts(log,4);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_SYSNAME");
  zt_log_set_opts(log,0xc);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_SYSNAME | ZT_LOG_WITH_PROGNAME");
  zt_log_set_opts(log,8);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_PROGNAME");
  zt_log_set_opts(log,0x10);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_PID");
  zt_log_set_opts(log,0x1d);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_EMU_SYSLOG");
  zt_log_set_opts(log,0);
  sprintf(position1,"(%s:%d)",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/log_test.c"
          ,0x3e);
  sprintf(position2,"(%s:%d)",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/log_test.c"
          ,0x3f);
  zt_log_set_debug_info
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/log_test.c"
             ,0x3f,"basic_tests");
  zt_log_lprintf(log,zt_log_debug,"lprintf with debugging");
  zt_log_logger(log_00);
  zt_log_close(log);
  __stream = fopen("log.err","r");
  pid = 0;
  date = 0;
  if (__stream == (FILE *)0x0) {
    pcVar2 = "(file)";
    uVar3 = 0x51;
  }
  else {
    zt_unit_test_add_assertion(test);
    iVar1 = __isoc99_fscanf(__stream,"%s\n",msg);
    if ((iVar1 == 1) &&
       (CONCAT17(msg[10],CONCAT16(msg[9],CONCAT15(msg[8],CONCAT14(msg[7],CONCAT13(msg[6],CONCAT12(
                                                  msg[5],CONCAT11(msg[4],msg[3]))))))) ==
        0x5741525f474f4c &&
        CONCAT17(msg[7],CONCAT16(msg[6],CONCAT15(msg[5],CONCAT14(msg[4],CONCAT13(msg[3],CONCAT12(msg
                                                  [2],CONCAT11(msg[1],msg[0]))))))) ==
        0x525f474f4c5f545a)) {
      zt_unit_test_add_assertion(test);
      iVar1 = __isoc99_fscanf(__stream,"%s %d %s : %s\n",month,&date,time,msg);
      if ((iVar1 == 4) &&
         ((msg[0x10] == '\0' &&
          CONCAT17(msg[7],CONCAT16(msg[6],CONCAT15(msg[5],CONCAT14(msg[4],CONCAT13(msg[3],CONCAT12(
                                                  msg[2],CONCAT11(msg[1],msg[0]))))))) ==
          0x575f474f4c5f545a) &&
          CONCAT17(msg[0xf],CONCAT16(msg[0xe],CONCAT15(msg[0xd],CONCAT14(msg[0xc],CONCAT13(msg[0xb],
                                                  CONCAT12(msg[10],CONCAT11(msg[9],msg[8]))))))) ==
          0x455441445f485449)) {
        zt_unit_test_add_assertion(test);
        iVar1 = __isoc99_fscanf(__stream,"%s %s\n",level,msg);
        if ((iVar1 == 2) &&
           (auVar4[0] = -(msg[0] == 'Z'), auVar4[1] = -(msg[1] == 'T'), auVar4[2] = -(msg[2] == '_')
           , auVar4[3] = -(msg[3] == 'L'), auVar4[4] = -(msg[4] == 'O'),
           auVar4[5] = -(msg[5] == 'G'), auVar4[6] = -(msg[6] == '_'), auVar4[7] = -(msg[7] == 'W'),
           auVar4[8] = -(msg[8] == 'I'), auVar4[9] = -(msg[9] == 'T'),
           auVar4[10] = -(msg[10] == 'H'), auVar4[0xb] = -(msg[0xb] == '_'),
           auVar4[0xc] = -(msg[0xc] == 'L'), auVar4[0xd] = -(msg[0xd] == 'E'),
           auVar4[0xe] = -(msg[0xe] == 'V'), auVar4[0xf] = -(msg[0xf] == 'E'),
           auVar9[0] = -((char)msg._16_4_ == 'L'), auVar9[1] = -(SUB41(msg._16_4_,1) == '\0'),
           auVar9[2] = 0xff, auVar9[3] = 0xff, auVar9[4] = 0xff, auVar9[5] = 0xff, auVar9[6] = 0xff,
           auVar9[7] = 0xff, auVar9[8] = 0xff, auVar9[9] = 0xff, auVar9[10] = 0xff,
           auVar9[0xb] = 0xff, auVar9[0xc] = 0xff, auVar9[0xd] = 0xff, auVar9[0xe] = 0xff,
           auVar9[0xf] = 0xff, auVar9 = auVar9 & auVar4,
           (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff)) {
          zt_unit_test_add_assertion(test);
          iVar1 = __isoc99_fscanf(__stream,"%s %s\n",sysname,msg);
          if (iVar1 == 2) {
            auVar10[0] = -((char)msg._16_4_ == 'A');
            auVar10[1] = -(SUB41(msg._16_4_,1) == 'M');
            auVar10[2] = -(SUB41(msg._16_4_,2) == 'E');
            auVar10[3] = -(SUB41(msg._16_4_,3) == '\0');
            auVar10[4] = 0xff;
            auVar10[5] = 0xff;
            auVar10[6] = 0xff;
            auVar10[7] = 0xff;
            auVar10[8] = 0xff;
            auVar10[9] = 0xff;
            auVar10[10] = 0xff;
            auVar10[0xb] = 0xff;
            auVar10[0xc] = 0xff;
            auVar10[0xd] = 0xff;
            auVar10[0xe] = 0xff;
            auVar10[0xf] = 0xff;
            auVar5[0] = -(msg[0] == 'Z');
            auVar5[1] = -(msg[1] == 'T');
            auVar5[2] = -(msg[2] == '_');
            auVar5[3] = -(msg[3] == 'L');
            auVar5[4] = -(msg[4] == 'O');
            auVar5[5] = -(msg[5] == 'G');
            auVar5[6] = -(msg[6] == '_');
            auVar5[7] = -(msg[7] == 'W');
            auVar5[8] = -(msg[8] == 'I');
            auVar5[9] = -(msg[9] == 'T');
            auVar5[10] = -(msg[10] == 'H');
            auVar5[0xb] = -(msg[0xb] == '_');
            auVar5[0xc] = -(msg[0xc] == 'S');
            auVar5[0xd] = -(msg[0xd] == 'Y');
            auVar5[0xe] = -(msg[0xe] == 'S');
            auVar5[0xf] = -(msg[0xf] == 'N');
            auVar5 = auVar5 & auVar10;
            if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
              zt_unit_test_add_assertion(test);
              iVar1 = __isoc99_fscanf(__stream,"%s %s %[A-Z_| ]\n",sysname,progname,msg);
              if (iVar1 == 3) {
                iVar1 = bcmp(msg,"ZT_LOG_WITH_SYSNAME | ZT_LOG_WITH_PROGNAME",0x2b);
                if (iVar1 == 0) {
                  zt_unit_test_add_assertion(test);
                  iVar1 = __isoc99_fscanf(__stream,"%s %s\n",progname,msg);
                  if ((iVar1 == 2) &&
                     (auVar11[0] = -(msg[5] == 'G'), auVar11[1] = -(msg[6] == '_'),
                     auVar11[2] = -(msg[7] == 'W'), auVar11[3] = -(msg[8] == 'I'),
                     auVar11[4] = -(msg[9] == 'T'), auVar11[5] = -(msg[10] == 'H'),
                     auVar11[6] = -(msg[0xb] == '_'), auVar11[7] = -(msg[0xc] == 'P'),
                     auVar11[8] = -(msg[0xd] == 'R'), auVar11[9] = -(msg[0xe] == 'O'),
                     auVar11[10] = -(msg[0xf] == 'G'), auVar11[0xb] = -(msg[0x10] == 'N'),
                     auVar11[0xc] = -(msg[0x11] == 'A'), auVar11[0xd] = -(msg[0x12] == 'M'),
                     auVar11[0xe] = -(msg[0x13] == 'E'), auVar11[0xf] = -(msg[0x14] == '\0'),
                     auVar6[0] = -(msg[0] == 'Z'), auVar6[1] = -(msg[1] == 'T'),
                     auVar6[2] = -(msg[2] == '_'), auVar6[3] = -(msg[3] == 'L'),
                     auVar6[4] = -(msg[4] == 'O'), auVar6[5] = -(msg[5] == 'G'),
                     auVar6[6] = -(msg[6] == '_'), auVar6[7] = -(msg[7] == 'W'),
                     auVar6[8] = -(msg[8] == 'I'), auVar6[9] = -(msg[9] == 'T'),
                     auVar6[10] = -(msg[10] == 'H'), auVar6[0xb] = -(msg[0xb] == '_'),
                     auVar6[0xc] = -(msg[0xc] == 'P'), auVar6[0xd] = -(msg[0xd] == 'R'),
                     auVar6[0xe] = -(msg[0xe] == 'O'), auVar6[0xf] = -(msg[0xf] == 'G'),
                     auVar6 = auVar6 & auVar11,
                     (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff)) {
                    zt_unit_test_add_assertion(test);
                    iVar1 = __isoc99_fscanf(__stream,"[%d]: %s\n",&pid,msg);
                    if ((iVar1 == 2) &&
                       (auVar7[0] = -(msg[0] == 'Z'), auVar7[1] = -(msg[1] == 'T'),
                       auVar7[2] = -(msg[2] == '_'), auVar7[3] = -(msg[3] == 'L'),
                       auVar7[4] = -(msg[4] == 'O'), auVar7[5] = -(msg[5] == 'G'),
                       auVar7[6] = -(msg[6] == '_'), auVar7[7] = -(msg[7] == 'W'),
                       auVar7[8] = -(msg[8] == 'I'), auVar7[9] = -(msg[9] == 'T'),
                       auVar7[10] = -(msg[10] == 'H'), auVar7[0xb] = -(msg[0xb] == '_'),
                       auVar7[0xc] = -(msg[0xc] == 'P'), auVar7[0xd] = -(msg[0xd] == 'I'),
                       auVar7[0xe] = -(msg[0xe] == 'D'), auVar7[0xf] = -(msg[0xf] == '\0'),
                       (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                               (ushort)(auVar7[0xf] >> 7) << 0xf) == 0xffff)) {
                      zt_unit_test_add_assertion(test);
                      iVar1 = __isoc99_fscanf(__stream,"%s %d %s %s %[a-zA-Z_-][%d]: %s\n",month,
                                              &date,time,sysname,progname,&pid,msg);
                      if ((iVar1 == 7) &&
                         (auVar8[0] = -(msg[0] == 'Z'), auVar8[1] = -(msg[1] == 'T'),
                         auVar8[2] = -(msg[2] == '_'), auVar8[3] = -(msg[3] == 'L'),
                         auVar8[4] = -(msg[4] == 'O'), auVar8[5] = -(msg[5] == 'G'),
                         auVar8[6] = -(msg[6] == '_'), auVar8[7] = -(msg[7] == 'E'),
                         auVar8[8] = -(msg[8] == 'M'), auVar8[9] = -(msg[9] == 'U'),
                         auVar8[10] = -(msg[10] == '_'), auVar8[0xb] = -(msg[0xb] == 'S'),
                         auVar8[0xc] = -(msg[0xc] == 'Y'), auVar8[0xd] = -(msg[0xd] == 'S'),
                         auVar8[0xe] = -(msg[0xe] == 'L'), auVar8[0xf] = -(msg[0xf] == 'O'),
                         auVar12[0] = -((char)msg._16_2_ == 'G'),
                         auVar12[1] = -(SUB21(msg._16_2_,1) == '\0'), auVar12[2] = 0xff,
                         auVar12[3] = 0xff, auVar12[4] = 0xff, auVar12[5] = 0xff, auVar12[6] = 0xff,
                         auVar12[7] = 0xff, auVar12[8] = 0xff, auVar12[9] = 0xff, auVar12[10] = 0xff
                         , auVar12[0xb] = 0xff, auVar12[0xc] = 0xff, auVar12[0xd] = 0xff,
                         auVar12[0xe] = 0xff, auVar12[0xf] = 0xff, auVar12 = auVar12 & auVar8,
                         (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff)) {
                        zt_unit_test_add_assertion(test);
                        fclose(__stream);
                        return;
                      }
                      pcVar2 = "((items == 7) && (!strcmp(msg, \"ZT_LOG_EMU_SYSLOG\")))";
                      uVar3 = 0x6b;
                    }
                    else {
                      pcVar2 = "((items == 2) && (!strcmp(msg, \"ZT_LOG_WITH_PID\")))";
                      uVar3 = 0x68;
                    }
                  }
                  else {
                    pcVar2 = "((items == 2) && (!strcmp(msg, \"ZT_LOG_WITH_PROGNAME\")))";
                    uVar3 = 0x65;
                  }
                  goto LAB_0011109b;
                }
              }
              pcVar2 = 
              "((items == 3) && (!strcmp(msg, \"ZT_LOG_WITH_SYSNAME | ZT_LOG_WITH_PROGNAME\")))";
              uVar3 = 0x61;
              goto LAB_0011109b;
            }
          }
          pcVar2 = "((items == 2) && (!strcmp(msg, \"ZT_LOG_WITH_SYSNAME\")))";
          uVar3 = 0x5e;
        }
        else {
          pcVar2 = "((items == 2) && (!strcmp(msg, \"ZT_LOG_WITH_LEVEL\")))";
          uVar3 = 0x5a;
        }
      }
      else {
        pcVar2 = "((items == 4) && (!strcmp(msg, \"ZT_LOG_WITH_DATE\")))";
        uVar3 = 0x57;
      }
    }
    else {
      pcVar2 = "((items == 1) && (!strcmp(msg, \"ZT_LOG_RAW\")))";
      uVar3 = 0x54;
    }
  }
LAB_0011109b:
  iVar1 = zt_unit_printf(&test->error,"%s : %s:%d",pcVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/log_test.c"
                         ,uVar3);
  if (iVar1 == 0) {
    test->error = (char *)0x0;
  }
  longjmp((__jmp_buf_tag *)test->env,1);
}

Assistant:

static void
basic_tests(struct zt_unit_test *test, void *data UNUSED)
{
    char          position1[255];
    char          position2[255];
    zt_log_ty   * logger;
    /* zt_log_ty *lstderr = zt_log_stderr((ZT_LOG_WITH_PROGNAME | ZT_LOG_WITH_LEVEL));  */
    zt_log_ty   * lfile = zt_log_file( "log.err",
                                      ZT_LOG_FILE_OVERWRITE,
                                      (ZT_LOG_EMU_SYSLOG | ZT_LOG_WITH_LEVEL));

    /*    zt_log_ty *lsyslog = zt_log_syslog(LOG_PID, LOG_DAEMON, ZT_LOG_RAW); */

    zt_progname("."PATH_SEPERATOR"unit_test", STRIP_DIR);

    /* capture the standard logger and set to the new logger */
    logger = zt_log_logger(lfile);

    zt_log_set_opts(lfile, (ZT_LOG_RAW));
    zt_log_printf( zt_log_debug, "ZT_LOG_RAW" );

    zt_log_set_opts(lfile, (ZT_LOG_WITH_DATE));
    zt_log_printf( zt_log_debug, "ZT_LOG_WITH_DATE" );

    zt_log_set_opts(lfile, (ZT_LOG_WITH_LEVEL));
    zt_log_printf( zt_log_debug, "ZT_LOG_WITH_LEVEL" );

    zt_log_set_opts(lfile, (ZT_LOG_WITH_SYSNAME));
    zt_log_printf( zt_log_debug, "ZT_LOG_WITH_SYSNAME" );

    zt_log_set_opts(lfile, (ZT_LOG_WITH_SYSNAME | ZT_LOG_WITH_PROGNAME));
    zt_log_printf( zt_log_debug, "ZT_LOG_WITH_SYSNAME | ZT_LOG_WITH_PROGNAME" );

    zt_log_set_opts(lfile, (ZT_LOG_WITH_PROGNAME));
    zt_log_printf( zt_log_debug, "ZT_LOG_WITH_PROGNAME" );

    zt_log_set_opts(lfile, (ZT_LOG_WITH_PID));
    zt_log_printf( zt_log_debug, "ZT_LOG_WITH_PID" );

    zt_log_set_opts(lfile, (ZT_LOG_EMU_SYSLOG));
    zt_log_printf( zt_log_debug, "ZT_LOG_EMU_SYSLOG" );

    zt_log_set_opts(lfile, (ZT_LOG_RAW));

    /* these need to be on the same line for the test to work */
    sprintf(position1, "(%s:%d)", __FILE__, __LINE__); ZT_LOG_XDEBUG( "LOG_DEBUG" );
    sprintf(position2, "(%s:%d)", __FILE__, __LINE__); ZT_LOG_DEBUG_INFO(), zt_log_lprintf(lfile, zt_log_debug, "lprintf with debugging");

    /* reset to the default logger */
    zt_log_logger(logger);

    zt_log_close(lfile);

    {
        FILE *file = fopen("log.err", "r");
        int   items = 0;
        char  msg[255];
        char  level[255];
        char  sysname[255];
        char  progname[255];
        int   pid = 0;
        char  month[255];
        int   date = 0;
        char  time[255];
        ZT_UNIT_ASSERT(test, (file));
        items = fscanf(file, "%s\n", msg);
        ZT_UNIT_ASSERT(test, ((items == 1) &&
                              (!strcmp(msg, "ZT_LOG_RAW"))));
        items = fscanf(file, "%s %d %s : %s\n", month, &date, time, msg);
        ZT_UNIT_ASSERT(test, ((items == 4) &&
                              (!strcmp(msg, "ZT_LOG_WITH_DATE"))));
        items = fscanf(file, "%s %s\n", level, msg);
        ZT_UNIT_ASSERT(test, ((items == 2) &&
                              (!strcmp(msg, "ZT_LOG_WITH_LEVEL"))));

        items = fscanf(file, "%s %s\n", sysname, msg);
        ZT_UNIT_ASSERT(test, ((items == 2) &&
                              (!strcmp(msg, "ZT_LOG_WITH_SYSNAME"))));
        items = fscanf(file, "%s %s %[A-Z_| ]\n", sysname, progname, msg);
        ZT_UNIT_ASSERT(test, ((items == 3) &&
                              (!strcmp(msg, "ZT_LOG_WITH_SYSNAME | ZT_LOG_WITH_PROGNAME"))));

        items = fscanf(file, "%s %s\n", progname, msg);
        ZT_UNIT_ASSERT(test, ((items == 2) &&
                              (!strcmp(msg, "ZT_LOG_WITH_PROGNAME"))));
        items = fscanf(file, "[%d]: %s\n", &pid, msg);
        ZT_UNIT_ASSERT(test, ((items == 2) &&
                              (!strcmp(msg, "ZT_LOG_WITH_PID"))));
        items = fscanf(file, "%s %d %s %s %[a-zA-Z_-][%d]: %s\n", month, &date, time, sysname, progname, &pid, msg);
        ZT_UNIT_ASSERT(test, ((items == 7) &&
                              (!strcmp(msg, "ZT_LOG_EMU_SYSLOG"))));
#ifdef DEBUG
        items = fscanf(file, "LOG_DEBUG: in basic_tests at %s\n", msg);
        ZT_UNIT_ASSERT(test, ((items == 1) &&
                              (!strcmp(msg, position1))));
#endif

#if 0
        /* issues with paths with spaces in them */
        items = fscanf(file, "lprintf with debugging: in basic_tests at %s\n", msg);
        ZT_UNIT_ASSERT(test, ((items == 1) &&
                              (!strcmp(msg, position2))));
#endif
        fclose(file);
        /* unlink("log.err"); */
    }
}